

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_equal_bitset(array_container_t *container1,bitset_container_t *container2)

{
  short sVar1;
  ulong uVar2;
  uint16_t r;
  uint64_t t;
  uint64_t w;
  int32_t i;
  int32_t pos;
  bitset_container_t *container2_local;
  array_container_t *container1_local;
  
  if ((container2->cardinality == -1) || (container2->cardinality == container1->cardinality)) {
    w._4_4_ = 0;
    for (w._0_4_ = 0; (int)w < 0x400; w._0_4_ = (int)w + 1) {
      for (t = container2->words[(int)w]; t != 0; t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
        sVar1 = 0;
        for (uVar2 = t; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
          sVar1 = sVar1 + 1;
        }
        if (container1->cardinality <= w._4_4_) {
          return false;
        }
        if (container1->array[w._4_4_] != (uint16_t)((short)((int)w << 6) + sVar1)) {
          return false;
        }
        w._4_4_ = w._4_4_ + 1;
      }
    }
    container1_local._7_1_ = w._4_4_ == container1->cardinality;
  }
  else {
    container1_local._7_1_ = false;
  }
  return container1_local._7_1_;
}

Assistant:

bool array_container_equal_bitset(const array_container_t* container1,
                                  const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality != container1->cardinality) {
            return false;
        }
    }
    int32_t pos = 0;
    for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
        uint64_t w = container2->words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            uint16_t r = i * 64 + __builtin_ctzll(w);
            if (pos >= container1->cardinality) {
                return false;
            }
            if (container1->array[pos] != r) {
                return false;
            }
            ++pos;
            w ^= t;
        }
    }
    return (pos == container1->cardinality);
}